

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QSimpleParsedNumber<long_long> __thiscall
QLocaleData::stringToLongLong
          (QLocaleData *this,QStringView str,int base,NumberOptions number_options)

{
  QVLAStorage<1UL,_1UL,_256LL> *__s;
  QByteArrayView num;
  QSimpleParsedNumber<long_long> QVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QSimpleParsedNumber<long_long> QVar3;
  CharBuff local_150;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
  memset(__s,0xaa,0x100);
  local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
  local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
  local_150.super_QVLABase<char>.super_QVLABaseBase.ptr = __s;
  bVar2 = numberToCLocale(this,str,number_options,IntegerMode,&local_150);
  if (bVar2) {
    num.m_data = (storage_type *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr;
    num.m_size = local_150.super_QVLABase<char>.super_QVLABaseBase.s;
    QVar3 = qstrntoll((char *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
                      local_150.super_QVLABase<char>.super_QVLABaseBase.s,base);
    bVar2 = checkParsed(num,QVar3.used);
    QVar1 = (QSimpleParsedNumber<long_long>)ZEXT816(0);
    if (bVar2) {
      QVar1 = QVar3;
    }
  }
  else {
    QVar1 = (QSimpleParsedNumber<long_long>)ZEXT816(0);
  }
  if ((QVLAStorage<1UL,_1UL,_256LL> *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr != __s)
  {
    QtPrivate::sizedFree
              (local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
               local_150.super_QVLABase<char>.super_QVLABaseBase.a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSimpleParsedNumber<qint64>
QLocaleData::stringToLongLong(QStringView str, int base,
                              QLocale::NumberOptions number_options) const
{
    CharBuff buff;
    if (!numberToCLocale(str, number_options, IntegerMode, &buff))
        return {};

    return bytearrayToLongLong(QByteArrayView(buff), base);
}